

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O0

int Gia_Rsb2ManMffc(Gia_Rsb2Man_t *p,int iNode)

{
  int iVar1;
  int *pRefs_00;
  int *pObjs_00;
  int *pObjs;
  int *pRefs;
  int i;
  int iNode_local;
  Gia_Rsb2Man_t *p_local;
  
  Vec_IntFill(&p->vRefs,p->nObjs,0);
  pRefs_00 = Vec_IntArray(&p->vRefs);
  pObjs_00 = Vec_IntArray(&p->vObjs);
  if (pObjs_00[iNode << 1] == pObjs_00[iNode * 2 + 1]) {
    __assert_fail("pObjs[2*iNode+0] != pObjs[2*iNode+1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0xf0,"int Gia_Rsb2ManMffc(Gia_Rsb2Man_t *, int)");
  }
  pRefs._0_4_ = p->nPis;
  while (pRefs._0_4_ = (int)pRefs + 1, (int)pRefs < p->iFirstPo) {
    iVar1 = Abc_Lit2Var(pObjs_00[(int)pRefs * 2]);
    pRefs_00[iVar1] = pRefs_00[iVar1] + 1;
    iVar1 = Abc_Lit2Var(pObjs_00[(int)pRefs * 2 + 1]);
    pRefs_00[iVar1] = pRefs_00[iVar1] + 1;
  }
  for (pRefs._0_4_ = p->iFirstPo; (int)pRefs < p->nObjs; pRefs._0_4_ = (int)pRefs + 1) {
    iVar1 = Abc_Lit2Var(pObjs_00[(int)pRefs << 1]);
    pRefs_00[iVar1] = pRefs_00[iVar1] + 1;
  }
  pRefs._0_4_ = p->nPis;
  do {
    pRefs._0_4_ = (int)pRefs + 1;
    if (p->iFirstPo <= (int)pRefs) {
      pRefs_00[iNode] = 0;
      for (pRefs._0_4_ = iNode + 1; (int)pRefs < p->iFirstPo; pRefs._0_4_ = (int)pRefs + 1) {
        iVar1 = Abc_Lit2Var(pObjs_00[(int)pRefs << 1]);
        if ((pRefs_00[iVar1] == 0) ||
           (iVar1 = Abc_Lit2Var(pObjs_00[(int)pRefs * 2 + 1]), pRefs_00[iVar1] == 0)) {
          pRefs_00[(int)pRefs] = 0;
        }
      }
      iVar1 = Gia_Rsb2ManDeref_rec(p,pObjs_00,pRefs_00,iNode);
      return iVar1;
    }
  } while (pRefs_00[(int)pRefs] != 0);
  __assert_fail("pRefs[i]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                ,0xf7,"int Gia_Rsb2ManMffc(Gia_Rsb2Man_t *, int)");
}

Assistant:

int Gia_Rsb2ManMffc( Gia_Rsb2Man_t * p, int iNode )
{
    int i, * pRefs, * pObjs;
    Vec_IntFill( &p->vRefs, p->nObjs, 0 );
    pRefs = Vec_IntArray( &p->vRefs );
    pObjs = Vec_IntArray( &p->vObjs );
    assert( pObjs[2*iNode+0] != pObjs[2*iNode+1] );
    for ( i = p->nPis + 1; i < p->iFirstPo; i++ )
        pRefs[Abc_Lit2Var(pObjs[2*i+0])]++, 
        pRefs[Abc_Lit2Var(pObjs[2*i+1])]++;
    for ( i = p->iFirstPo; i < p->nObjs; i++ )
        pRefs[Abc_Lit2Var(pObjs[2*i+0])]++;
    for ( i = p->nPis + 1; i < p->iFirstPo; i++ )
        assert( pRefs[i] );
    pRefs[iNode] = 0;
    for ( i = iNode + 1; i < p->iFirstPo; i++ )
        if ( !pRefs[Abc_Lit2Var(pObjs[2*i+0])] || !pRefs[Abc_Lit2Var(pObjs[2*i+1])] )
            pRefs[i] = 0;
    return Gia_Rsb2ManDeref_rec( p, pObjs, pRefs, iNode );
}